

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O1

void __thiscall
supermap::SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>::append
          (SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void> *this,
          unique_ptr<supermap::KeyValue<char,_char>,_std::default_delete<supermap::KeyValue<char,_char>_>_>
          *item)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  KeyValue<char,_char> *value;
  ostream *os;
  long *local_78;
  string local_70;
  path local_50;
  
  peVar1 = (this->storageFile_).
           super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = (peVar1->manager_).
           super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar1->manager_).
            super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void>::getStorageFilePath_abi_cxx11_
            (&local_70,(SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void> *)this);
  std::filesystem::__cxx11::path::path(&local_50,&local_70,auto_format);
  (*peVar2->_vptr_FileManager[1])(&local_78,peVar2,&local_50,1);
  std::filesystem::__cxx11::path::~path(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  value = (item->_M_t).
          super___uniq_ptr_impl<supermap::KeyValue<char,_char>,_std::default_delete<supermap::KeyValue<char,_char>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_supermap::KeyValue<char,_char>_*,_std::default_delete<supermap::KeyValue<char,_char>_>_>
          .super__Head_base<0UL,_supermap::KeyValue<char,_char>_*,_false>._M_head_impl;
  os = (ostream *)(**(code **)*local_78)(local_78);
  io::ShallowSerializer<char>::serialize(&value->key,os);
  io::ShallowSerializer<char>::serialize(&value->value,os);
  (**(code **)(*local_78 + 8))(local_78);
  (*(this->super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
    super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.register_.
    super_StorageItemRegister<supermap::KeyValue<char,_char>,_supermap::CountingStorageInfo<char,_void>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_supermap::CountingStorageInfo<char,_void>_>_>
    ._vptr_Cloneable[3])
            (&(this->super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
              super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.register_,
             (item->_M_t).
             super___uniq_ptr_impl<supermap::KeyValue<char,_char>,_std::default_delete<supermap::KeyValue<char,_char>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_supermap::KeyValue<char,_char>_*,_std::default_delete<supermap::KeyValue<char,_char>_>_>
             .super__Head_base<0UL,_supermap::KeyValue<char,_char>_*,_false>._M_head_impl);
  (**(code **)(*local_78 + 0x18))(local_78);
  return;
}

Assistant:

void append(std::unique_ptr<T> &&item) override {
        io::OutputIterator<T> writer = getFileManager()->template getOutputIterator<T>(getStorageFilePath(), true);
        writer.write(*item);
        writer.flush();
        getRegister().registerItem(*item);
    }